

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O1

void __thiscall
num_parse_test_parse_signed_limits_Test::TestBody(num_parse_test_parse_signed_limits_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  int res32;
  int32_t min32;
  int32_t max32;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertHelper local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  int local_14 [3];
  
  local_14[2] = 0x7fffffff;
  local_14[0] = 0x7fffffff;
  testing::internal::CmpHelperEQ<int,int>(local_28,"res32","max32",local_14,local_14 + 2);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_14[1] = 0x80000000;
  local_14[0] = -0x80000000;
  testing::internal::CmpHelperEQ<int,int>(local_28,"res32","min32",local_14,local_14 + 1);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kenavolic[P]mvm/tests/num_parse_test.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
      local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(num_parse_test, parse_signed_limits) {
  int32_t max32 = std::numeric_limits<int32_t>::max();
  auto res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&max32));
  EXPECT_EQ(res32, max32);

  int32_t min32 = std::numeric_limits<int32_t>::min();
  res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&min32));
  EXPECT_EQ(res32, min32);
}